

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::
      SelectGenericLoop<duckdb::string_t,duckdb::string_t,duckdb::GreaterThan,true,false,true>
                (string_t *ldata,string_t *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  idx_t i;
  ulong uVar5;
  long lVar6;
  
  lVar6 = 0;
  for (uVar5 = 0; count != uVar5; uVar5 = uVar5 + 1) {
    uVar4 = uVar5;
    if (result_sel->sel_vector != (sel_t *)0x0) {
      uVar4 = (ulong)result_sel->sel_vector[uVar5];
    }
    uVar3 = uVar5;
    if (lsel->sel_vector != (sel_t *)0x0) {
      uVar3 = (ulong)lsel->sel_vector[uVar5];
    }
    uVar2 = uVar5;
    if (rsel->sel_vector != (sel_t *)0x0) {
      uVar2 = (ulong)rsel->sel_vector[uVar5];
    }
    bVar1 = string_t::StringComparisonOperators::GreaterThan(ldata + uVar3,rdata + uVar2);
    if (!bVar1) {
      false_sel->sel_vector[lVar6] = (sel_t)uVar4;
      lVar6 = lVar6 + 1;
    }
  }
  return count - lVar6;
}

Assistant:

static inline idx_t
	SelectGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                  const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                  const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                  ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
#ifdef DUCKDB_SMALLER_BINARY
		const bool HAS_TRUE_SEL = true_sel;
		const bool HAS_FALSE_SEL = false_sel;
		const bool NO_NULL = false;
#endif
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto lindex = lsel->get_index(i);
			auto rindex = rsel->get_index(i);
			if ((NO_NULL || (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex))) &&
			    OP::Operation(ldata[lindex], rdata[rindex])) {
				if (HAS_TRUE_SEL) {
					true_sel->set_index(true_count++, result_idx);
				}
			} else {
				if (HAS_FALSE_SEL) {
					false_sel->set_index(false_count++, result_idx);
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}